

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

cbtVector3 TriNormal(cbtVector3 *v0,cbtVector3 *v1,cbtVector3 *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  cbtVector3 cVar10;
  cbtVector3 cVar11;
  
  fVar8 = v1->m_floats[2] - v0->m_floats[2];
  fVar9 = v1->m_floats[0] - v0->m_floats[0];
  fVar1 = v1->m_floats[1] - v0->m_floats[1];
  fVar2 = v2->m_floats[0] - v1->m_floats[0];
  fVar3 = v2->m_floats[1] - v1->m_floats[1];
  fVar4 = v2->m_floats[2] - v1->m_floats[2];
  auVar5 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar8)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar4))
  ;
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar9)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar8))
  ;
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),ZEXT416((uint)fVar9),ZEXT416((uint)fVar3))
  ;
  fVar8 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar5,auVar5);
  auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  fVar9 = auVar6._0_4_;
  if ((fVar9 == 0.0) && (!NAN(fVar9))) {
    cVar10.m_floats._0_8_ = SUB648(ZEXT464(0x3f800000),0);
    cVar10.m_floats[2] = 0.0;
    cVar10.m_floats[3] = 0.0;
    return (cbtVector3)cVar10.m_floats;
  }
  fVar9 = 1.0 / fVar9;
  auVar6 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ * fVar9)),ZEXT416((uint)(fVar8 * fVar9)),0x10);
  cVar11.m_floats._0_8_ = auVar6._0_8_;
  cVar11.m_floats[2] = auVar7._0_4_ * fVar9;
  cVar11.m_floats[3] = 0.0;
  return (cbtVector3)cVar11.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator-(const cbtVector3& v1, const cbtVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return cbtVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return cbtVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return cbtVector3(
		v1.m_floats[0] - v2.m_floats[0],
		v1.m_floats[1] - v2.m_floats[1],
		v1.m_floats[2] - v2.m_floats[2]);
#endif
}